

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::checkDependencies(CommonCore *this)

{
  bool bVar1;
  size_type sVar2;
  pointer pBVar3;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *in_RDI;
  ActionMessage adddep_2;
  ActionMessage adddep_1;
  ActionMessage adddep;
  ActionMessage rmdep;
  GlobalFederateId *dep_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range1_1;
  GlobalFederateId *dep;
  iterator __end1;
  iterator __begin1;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range1;
  int localcnt;
  GlobalBrokerId brkid;
  GlobalFederateId fedid;
  anon_class_24_3_ad0d7dc2 checkdep;
  bool issource;
  bool isobs;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *this_00;
  ActionMessage *this_01;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_fffffffffffffb50;
  action_t startingAction;
  ActionMessage *this_02;
  CommonCore *in_stack_fffffffffffffb68;
  GlobalFederateId in_stack_fffffffffffffb74;
  GlobalFederateId in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  GlobalFederateId local_45c [3];
  uint local_450;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_fffffffffffffbf0;
  anon_class_24_3_ad0d7dc2 in_stack_fffffffffffffc00;
  ActionMessage *in_stack_fffffffffffffc40;
  CommonCore *in_stack_fffffffffffffc48;
  GlobalFederateId in_stack_fffffffffffffc54;
  GlobalFederateId local_394;
  BaseType local_390;
  GlobalFederateId local_38c;
  ActionMessage local_388;
  uint local_2cc;
  BaseType local_2c8;
  GlobalFederateId local_2c4;
  BaseType local_2c0;
  GlobalFederateId local_2bc;
  ActionMessage local_2b8;
  uint local_1fc;
  BaseType local_1f8;
  GlobalFederateId local_1f4;
  BaseType local_1f0;
  GlobalFederateId local_1ec [3];
  BaseType local_1e0;
  uint local_130;
  BaseType local_12c;
  GlobalFederateId local_128;
  uint local_124;
  BaseType local_120;
  GlobalFederateId local_11c;
  BaseType local_118;
  BaseType local_114;
  GlobalFederateId *local_110;
  int local_104;
  GlobalFederateId *local_100;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_f8;
  undefined1 local_f0 [24];
  undefined1 *local_d8;
  BaseType local_d0;
  BaseType local_bc;
  reference local_b8;
  GlobalFederateId *local_b0;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_a8;
  undefined1 local_a0 [24];
  undefined1 *local_88;
  int local_7c;
  GlobalBrokerId local_78;
  GlobalFederateId local_74;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_70;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_58;
  ActionMessage *local_38;
  byte *local_30;
  ActionMessage *local_20;
  byte *local_18;
  byte local_a;
  undefined1 local_9;
  
  local_9 = cmd_ignore;
  local_a = 0;
  this_01 = (ActionMessage *)&stack0xfffffffffffffff7;
  local_30 = &local_a;
  this_00 = in_RDI;
  local_38 = this_01;
  local_20 = this_01;
  local_18 = local_30;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>::
  apply<helics::CommonCore::checkDependencies()::__0>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffc00);
  CLI::std::
  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
  operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
              *)0x47a276);
  BaseTimeCoordinator::getDependents
            ((BaseTimeCoordinator *)
             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98.gid));
  sVar2 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::size
                    (&local_58);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
            (in_stack_fffffffffffffb50);
  if (sVar2 < 3) {
    CLI::std::
    unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
    operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                *)0x47a2ca);
    BaseTimeCoordinator::getDependencies
              ((BaseTimeCoordinator *)
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98.gid));
    sVar2 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::size
                      (&local_70);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
              (in_stack_fffffffffffffb50);
    if (sVar2 < 3) {
      GlobalFederateId::GlobalFederateId(&local_74);
      GlobalBrokerId::GlobalBrokerId(&local_78);
      local_7c = 0;
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x47a343);
      BaseTimeCoordinator::getDependents
                ((BaseTimeCoordinator *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98.gid));
      local_88 = local_a0;
      local_a8._M_current =
           (GlobalFederateId *)
           std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                     (this_00);
      local_b0 = (GlobalFederateId *)
                 std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                 end(this_00);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                               ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 *)this_01,
                                (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 *)this_00), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                   ::operator*(&local_a8);
        local_bc = local_b8->gid;
        bVar1 = isLocal(in_stack_fffffffffffffb68,in_stack_fffffffffffffb74);
        in_stack_fffffffffffffb74.gid = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb74.gid);
        if (bVar1) {
          local_7c = local_7c + 1;
          local_74.gid = local_b8->gid;
        }
        else {
          local_d0 = (BaseType)
                     GlobalFederateId::operator_cast_to_GlobalBrokerId((GlobalFederateId *)this_00);
          local_78 = (GlobalBrokerId)local_d0;
        }
        __gnu_cxx::
        __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
        ::operator++(&local_a8);
      }
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                (in_stack_fffffffffffffb50);
      if (local_7c < 2) {
        if ((local_7c != 0) || (bVar1 = GlobalBrokerId::isValid(&local_78), bVar1)) {
          CLI::std::
          unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
          ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                        *)0x47a4d1);
          BaseTimeCoordinator::getDependencies
                    ((BaseTimeCoordinator *)
                     CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98.gid));
          local_d8 = local_f0;
          local_f8._M_current =
               (GlobalFederateId *)
               std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
               begin(this_00);
          local_100 = (GlobalFederateId *)
                      std::
                      vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                      end(this_00);
          while (bVar1 = __gnu_cxx::
                         operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                   ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                     *)this_01,
                                    (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                     *)this_00), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_110 = __gnu_cxx::
                        __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                        ::operator*(&local_f8);
            local_114 = local_74.gid;
            bVar1 = GlobalFederateId::operator==(local_110,local_74);
            if (!bVar1) {
              local_118 = local_78.gid;
              bVar1 = GlobalFederateId::operator==(local_110,local_78);
              if (!bVar1) {
                local_104 = 1;
                goto LAB_0047a5c8;
              }
            }
            __gnu_cxx::
            __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
            ::operator++(&local_f8);
          }
          local_104 = 4;
LAB_0047a5c8:
          std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                    (in_stack_fffffffffffffb50);
          if (local_104 != 1) {
            this_02 = (ActionMessage *)(in_RDI + 10);
            pBVar3 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x47a5fd);
            local_120 = local_78.gid;
            GlobalFederateId::GlobalFederateId(&local_11c,local_78);
            (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)(uint)local_11c.gid);
            pBVar3 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x47a643);
            local_124 = local_74.gid;
            (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)(uint)local_74.gid);
            pBVar3 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x47a66e);
            local_12c = local_78.gid;
            GlobalFederateId::GlobalFederateId(&local_128,local_78);
            (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)local_128.gid);
            startingAction = (action_t)((ulong)pBVar3 >> 0x20);
            pBVar3 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x47a6b4);
            local_130 = local_74.gid;
            (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)local_74.gid);
            *(undefined1 *)
             ((long)&in_RDI[0x16].
                     super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
            ActionMessage::ActionMessage(this_02,startingAction);
            local_1f0 = *(BaseType *)
                         ((long)&(in_RDI->
                                 super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
            GlobalFederateId::GlobalFederateId(local_1ec,(GlobalBrokerId)local_1f0);
            local_1e0 = local_1ec[0].gid;
            local_1f8 = local_78.gid;
            GlobalFederateId::GlobalFederateId(&local_1f4,local_78);
            routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                         in_stack_fffffffffffffc54);
            local_1fc = local_74.gid;
            routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                         in_stack_fffffffffffffc54);
            if ((local_9 & cmd_tick) == cmd_ignore) {
              if ((local_a & 1) == 0) {
                ActionMessage::ActionMessage(this_02,startingAction);
                local_450 = local_74.gid;
                setActionFlag<helics::ActionMessage,helics::TimingFlags>
                          ((ActionMessage *)(local_45c + 1),child_flag);
                GlobalFederateId::GlobalFederateId(local_45c,local_78);
                routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc54);
                routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc54);
                GlobalFederateId::GlobalFederateId
                          ((GlobalFederateId *)&stack0xfffffffffffffb98,local_78);
                clearActionFlag<helics::ActionMessage,helics::TimingFlags>
                          ((ActionMessage *)(local_45c + 1),child_flag);
                setActionFlag<helics::ActionMessage,helics::TimingFlags>
                          ((ActionMessage *)(local_45c + 1),parent_flag);
                routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc54);
                ActionMessage::~ActionMessage(this_01);
              }
              else {
                ActionMessage::ActionMessage(this_02,startingAction);
                local_388.source_id.gid = local_74.gid;
                setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_388,child_flag);
                local_390 = local_78.gid;
                GlobalFederateId::GlobalFederateId(&local_38c,local_78);
                routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc54);
                ActionMessage::setAction(&local_388,cmd_add_dependent);
                clearActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_388,child_flag);
                setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_388,parent_flag);
                GlobalFederateId::GlobalFederateId(&local_394,local_78);
                local_388.source_id.gid = local_394.gid;
                routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc54);
                ActionMessage::~ActionMessage(this_01);
              }
            }
            else {
              ActionMessage::ActionMessage(this_02,startingAction);
              local_2b8.source_id.gid = local_74.gid;
              setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_2b8,child_flag);
              local_2c0 = local_78.gid;
              GlobalFederateId::GlobalFederateId(&local_2bc,local_78);
              routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                           in_stack_fffffffffffffc54);
              ActionMessage::setAction(&local_2b8,cmd_add_dependency);
              local_2c8 = local_78.gid;
              GlobalFederateId::GlobalFederateId(&local_2c4,local_78);
              local_2b8.source_id.gid = local_2c4.gid;
              clearActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_2b8,child_flag);
              setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_2b8,parent_flag);
              local_2cc = local_74.gid;
              routeMessage(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                           in_stack_fffffffffffffc54);
              ActionMessage::~ActionMessage(this_01);
            }
            ActionMessage::~ActionMessage(this_01);
          }
        }
        else {
          *(undefined1 *)
           ((long)&in_RDI[0x16].
                   super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::checkDependencies()
{
    bool isobs = false;
    bool issource = false;
    auto checkdep = [this, &isobs, &issource](auto& fed) {
        if (fed->endpointCount() > 0) {
            if (fed->getOptionFlag(defs::Flags::OBSERVER)) {
                timeCoord->removeDependency(fed->global_id);
                ActionMessage rmdep(CMD_REMOVE_DEPENDENT);

                rmdep.source_id = global_broker_id_local;
                rmdep.dest_id = fed->global_id.load();
                fed->addAction(rmdep);
                isobs = true;
            } else if (fed->getOptionFlag(defs::Flags::SOURCE_ONLY)) {
                timeCoord->removeDependent(fed->global_id);
                ActionMessage rmdep(CMD_REMOVE_DEPENDENCY);

                rmdep.source_id = global_broker_id_local;
                rmdep.dest_id = fed->global_id.load();
                fed->addAction(rmdep);
                issource = true;
            }
        }
    };
    loopFederates.apply(checkdep);

    // if there is more than 2 dependents or dependencies (higher broker + 2 or more federates)
    // then we need to be a timeCoordinator
    if (timeCoord->getDependents().size() > 2) {
        return;
    }
    if (timeCoord->getDependencies().size() > 2) {
        return;
    }
    GlobalFederateId fedid;
    GlobalBrokerId brkid;
    int localcnt = 0;
    for (const auto& dep : timeCoord->getDependents()) {
        if (isLocal(dep)) {
            ++localcnt;
            fedid = dep;
        } else {
            brkid = static_cast<GlobalBrokerId>(dep);
        }
    }
    if (localcnt > 1) {
        return;
    }
    if ((localcnt == 0) && (!brkid.isValid())) {
        hasTimeDependency = false;
        return;
    }
    // check to make sure the dependencies match
    for (auto& dep : timeCoord->getDependencies()) {
        if (!((dep == fedid) || (dep == brkid))) {
            return;
        }
    }
    // remove the core from the time dependency chain since it is just adding to the
    // communication noise in this case
    timeCoord->removeDependency(brkid);
    timeCoord->removeDependency(fedid);
    timeCoord->removeDependent(brkid);
    timeCoord->removeDependent(fedid);
    hasTimeDependency = false;
    ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);

    rmdep.source_id = global_broker_id_local;
    routeMessage(rmdep, brkid);
    routeMessage(rmdep, fedid);
    if (isobs) {
        ActionMessage adddep(CMD_ADD_DEPENDENT);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, brkid);
        adddep.setAction(CMD_ADD_DEPENDENCY);
        adddep.source_id = brkid;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    } else if (issource) {
        ActionMessage adddep(CMD_ADD_DEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, brkid);

        adddep.setAction(CMD_ADD_DEPENDENT);
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        adddep.source_id = brkid;
        routeMessage(adddep, fedid);
    } else {
        ActionMessage adddep(CMD_ADD_INTERDEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, brkid);
        // make sure the fed depends on itself in case the broker removes itself later
        routeMessage(adddep, fedid);
        adddep.source_id = brkid;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    }
}